

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenTableGet(BinaryenModuleRef module,char *name,BinaryenExpressionRef index,BinaryenType type)

{
  BinaryenType index_00;
  TableGet *pTVar1;
  Type local_48;
  string_view local_40;
  Builder local_30;
  BinaryenType local_28;
  BinaryenType type_local;
  BinaryenExpressionRef index_local;
  char *name_local;
  BinaryenModuleRef module_local;
  
  local_28 = type;
  type_local = (BinaryenType)index;
  index_local = (BinaryenExpressionRef)name;
  name_local = (char *)module;
  wasm::Builder::Builder(&local_30,module);
  wasm::Name::Name((Name *)&local_40,(char *)index_local);
  index_00 = type_local;
  wasm::Type::Type(&local_48,local_28);
  pTVar1 = wasm::Builder::makeTableGet(&local_30,(Name)local_40,(Expression *)index_00,local_48);
  return (BinaryenExpressionRef)pTVar1;
}

Assistant:

BinaryenExpressionRef BinaryenTableGet(BinaryenModuleRef module,
                                       const char* name,
                                       BinaryenExpressionRef index,
                                       BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeTableGet(name, (Expression*)index, Type(type)));
}